

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<double> *this;
  initializer_list<std::pair<int,_double>_> __l;
  initializer_list<double> __l_00;
  initializer_list<int> __l_01;
  bool bVar1;
  ostream *poVar2;
  allocator<std::pair<int,_double>_> *this_00;
  pair<int,_double> pVar3;
  undefined1 local_158 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> outputZip;
  double local_138;
  int local_12c;
  double local_128;
  int local_11c;
  double local_118;
  int local_10c;
  pair<int,_double> local_108;
  int local_f8;
  double local_f0;
  int local_e8;
  double local_e0;
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> expectedZip;
  double local_a8 [4];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> test2;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> test1;
  
  test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_48[0] = 1;
  local_48[1] = 3;
  local_48[2] = 0x22;
  local_48[3] = 0x32;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_01,&local_49);
  std::allocator<int>::~allocator(&local_49);
  local_a8[2] = 3.0;
  local_a8[0] = 1.0;
  local_a8[1] = 2.0;
  local_88 = local_a8;
  local_80 = 3;
  this = (allocator<double> *)
         ((long)&expectedZip.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  __l_00._M_len = local_80;
  __l_00._M_array = local_88;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_78,__l_00,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&expectedZip.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  poVar2 = std::operator<<((ostream *)&std::cout,"Test zip...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_10c = 1;
  local_118 = 1.0;
  pVar3 = std::make_pair<int,double>(&local_10c,&local_118);
  local_108.second = pVar3.second;
  local_108.first = pVar3.first;
  local_11c = 3;
  local_128 = 2.0;
  pVar3 = std::make_pair<int,double>(&local_11c,&local_128);
  local_f0 = pVar3.second;
  local_f8 = pVar3.first;
  local_12c = 0x22;
  local_138 = 3.0;
  pVar3 = std::make_pair<int,double>(&local_12c,&local_138);
  local_e0 = pVar3.second;
  local_e8 = pVar3.first;
  local_d8 = &local_108;
  local_d0 = 3;
  this_00 = (allocator<std::pair<int,_double>_> *)
            ((long)&outputZip.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::pair<int,_double>_>::allocator(this_00);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_c8,
             __l,this_00);
  std::allocator<std::pair<int,_double>_>::~allocator
            ((allocator<std::pair<int,_double>_> *)
             ((long)&outputZip.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Functional::
  zip<std::vector,int,std::allocator<int>,double,std::allocator<double>,std::pair<int,double>,std::allocator<std::pair<int,double>>>
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_158,
             (Functional *)local_28,(vector<int,_std::allocator<int>_> *)local_78,
             (vector<double,_std::allocator<double>_> *)this_00);
  bVar1 = std::operator==((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)local_c8,
                          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)local_158);
  if (!bVar1) {
    __assert_fail("expectedZip==outputZip",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/zip/main.cpp"
                  ,0x18,"int main()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_158);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return test1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){

    
  
  vector<int> test1={1, 3, 34, 50};
  vector<double> test2={1.0, 2.0, 3.0};

  cout << "Test zip..." << endl;
  vector< pair<int,double> > expectedZip={
      make_pair(1,1.0),
      make_pair(3,2.0),
      make_pair(34, 3.0)      
  };
  auto outputZip = Functional::zip(test1, test2);  
  assert( expectedZip==outputZip);
  cout << "passed!" << endl;

  return 0;

}